

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_log2_mips(float64 a,float_status *status)

{
  float64 fVar1;
  ulong local_50;
  uint64_t i;
  uint64_t zSig;
  uint64_t aSig1;
  uint64_t aSig0;
  uint64_t aSig;
  int aExp;
  flag zSign;
  flag aSign;
  float_status *status_local;
  float64 a_local;
  
  _aExp = status;
  status_local = (float_status *)a;
  status_local = (float_status *)float64_squash_input_denormal_mips(a,status);
  aSig0 = extractFloat64Frac((float64)status_local);
  aSig._0_4_ = extractFloat64Exp((float64)status_local);
  aSig._7_1_ = extractFloat64Sign((float64)status_local);
  if ((int)aSig == 0) {
    if (aSig0 == 0) {
      fVar1 = packFloat64('\x01',0x7ff,0);
      return fVar1;
    }
    normalizeFloat64Subnormal(aSig0,(int *)&aSig,&aSig0);
  }
  if (aSig._7_1_ == '\0') {
    if ((int)aSig == 0x7ff) {
      if (aSig0 == 0) {
        a_local = (float64)status_local;
      }
      else {
        a_local = propagateFloat64NaN((float64)status_local,0,_aExp);
      }
    }
    else {
      aSig._0_4_ = (int)aSig + -0x3ff;
      aSig0 = aSig0 | 0x10000000000000;
      aSig._6_1_ = (int)aSig < 0;
      i = (long)(int)aSig << 0x34;
      for (local_50 = 0x8000000000000; local_50 != 0; local_50 = local_50 >> 1) {
        mul64To128(aSig0,aSig0,&aSig1,&zSig);
        aSig0 = aSig1 << 0xc | zSig >> 0x34;
        if ((aSig1 << 0xc & 0x20000000000000) != 0) {
          aSig0 = aSig0 >> 1;
          i = local_50 | i;
        }
      }
      if (aSig._6_1_ != '\0') {
        i = -i;
      }
      a_local = normalizeRoundAndPackFloat64(aSig._6_1_,0x408,i,_aExp);
    }
  }
  else {
    float_raise_mips('\x01',_aExp);
    a_local = float64_default_nan_mips(_aExp);
  }
  return a_local;
}

Assistant:

float64 float64_log2(float64 a, float_status *status)
{
    flag aSign, zSign;
    int aExp;
    uint64_t aSig, aSig0, aSig1, zSig, i;
    a = float64_squash_input_denormal(a, status);

    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );

    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat64( 1, 0x7FF, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    if ( aSign ) {
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return propagateFloat64NaN(a, float64_zero, status);
        }
        return a;
    }

    aExp -= 0x3FF;
    aSig |= UINT64_C(0x0010000000000000);
    zSign = aExp < 0;
    zSig = (uint64_t)aExp << 52;
    for (i = 1LL << 51; i > 0; i >>= 1) {
        mul64To128( aSig, aSig, &aSig0, &aSig1 );
        aSig = ( aSig0 << 12 ) | ( aSig1 >> 52 );
        if ( aSig & UINT64_C(0x0020000000000000) ) {
            aSig >>= 1;
            zSig |= i;
        }
    }

    if ( zSign )
#ifdef _MSC_VER
        zSig = 0 - zSig;
#else
        zSig = -zSig;
#endif
    return normalizeRoundAndPackFloat64(zSign, 0x408, zSig, status);
}